

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidGetValidElements(xmlNode *prev,xmlNode *next,xmlChar **names,int max)

{
  xmlNodePtr elem;
  _xmlNode *p_Var1;
  _xmlNode *p_Var2;
  xmlChar *pxVar3;
  int iVar4;
  xmlNodePtr cur;
  _xmlNode *local_918;
  _xmlNode *local_910;
  xmlNode *local_908;
  int local_8fc;
  xmlElementPtr pxStack_8f8;
  int j;
  xmlElement *element_desc;
  xmlNode *parent_last;
  xmlNode *parent_childs;
  xmlNode *next_prev;
  xmlNode *prev_next;
  xmlNode *test_node;
  xmlNode *parent;
  xmlNode *ref_node;
  xmlChar *name;
  int i;
  int nb_elements;
  xmlChar *elements [256];
  undefined1 local_a0 [4];
  int nb_valid_elements;
  xmlValidCtxt vctxt;
  int max_local;
  xmlChar **names_local;
  xmlNode *next_local;
  xmlNode *prev_local;
  
  elements[0xff]._4_4_ = 0;
  vctxt.state._4_4_ = max;
  memset(&i,0,0x800);
  name._4_4_ = 0;
  if ((prev == (xmlNode *)0x0) && (next == (xmlNode *)0x0)) {
    prev_local._4_4_ = -1;
  }
  else if (names == (xmlChar **)0x0) {
    prev_local._4_4_ = -1;
  }
  else if (vctxt.state._4_4_ < 1) {
    prev_local._4_4_ = -1;
  }
  else {
    memset(local_a0,0,0x70);
    vctxt.userData = xmlNoValidityErr;
    elements[0xff]._4_4_ = 0;
    local_908 = next;
    if (prev != (xmlNode *)0x0) {
      local_908 = prev;
    }
    elem = local_908->parent;
    pxStack_8f8 = xmlGetDtdElementDesc(elem->doc->intSubset,elem->name);
    if ((pxStack_8f8 == (xmlElementPtr)0x0) && (elem->doc->extSubset != (_xmlDtd *)0x0)) {
      pxStack_8f8 = xmlGetDtdElementDesc(elem->doc->extSubset,elem->name);
    }
    if (pxStack_8f8 == (xmlElementPtr)0x0) {
      prev_local._4_4_ = -1;
    }
    else {
      if (prev == (xmlNode *)0x0) {
        local_910 = (_xmlNode *)0x0;
      }
      else {
        local_910 = prev->next;
      }
      if (next == (xmlNode *)0x0) {
        local_918 = (_xmlNode *)0x0;
      }
      else {
        local_918 = next->prev;
      }
      p_Var1 = elem->children;
      p_Var2 = elem->last;
      cur = xmlNewDocNode(local_908->doc,(xmlNsPtr)0x0,(xmlChar *)"<!dummy?>",(xmlChar *)0x0);
      if (cur == (xmlNodePtr)0x0) {
        prev_local._4_4_ = -1;
      }
      else {
        cur->parent = elem;
        cur->prev = prev;
        cur->next = next;
        pxVar3 = cur->name;
        if (prev == (xmlNode *)0x0) {
          elem->children = cur;
        }
        else {
          prev->next = cur;
        }
        if (next == (xmlNode *)0x0) {
          elem->last = cur;
        }
        else {
          next->prev = cur;
        }
        name._4_4_ = xmlValidGetPotentialChildren
                               (pxStack_8f8->content,(xmlChar **)&i,(int *)((long)&name + 4),0x100);
        for (name._0_4_ = 0; (int)name < name._4_4_; name._0_4_ = (int)name + 1) {
          cur->name = *(xmlChar **)(&i + (long)(int)name * 2);
          iVar4 = xmlValidateOneElement((xmlValidCtxtPtr)local_a0,elem->doc,elem);
          if (iVar4 != 0) {
            local_8fc = 0;
            while ((local_8fc < elements[0xff]._4_4_ &&
                   (iVar4 = xmlStrEqual(*(xmlChar **)(&i + (long)(int)name * 2),names[local_8fc]),
                   iVar4 == 0))) {
              local_8fc = local_8fc + 1;
            }
            iVar4 = elements[0xff]._4_4_;
            elements[0xff]._4_4_ = elements[0xff]._4_4_ + 1;
            names[iVar4] = *(xmlChar **)(&i + (long)(int)name * 2);
            if (vctxt.state._4_4_ <= elements[0xff]._4_4_) break;
          }
        }
        if (prev != (xmlNode *)0x0) {
          prev->next = local_910;
        }
        if (next != (xmlNode *)0x0) {
          next->prev = local_918;
        }
        elem->children = p_Var1;
        elem->last = p_Var2;
        cur->name = pxVar3;
        xmlFreeNode(cur);
        prev_local._4_4_ = elements[0xff]._4_4_;
      }
    }
  }
  return prev_local._4_4_;
}

Assistant:

int
xmlValidGetValidElements(xmlNode *prev, xmlNode *next, const xmlChar **names,
                         int max) {
    xmlValidCtxt vctxt;
    int nb_valid_elements = 0;
    const xmlChar *elements[256]={0};
    int nb_elements = 0, i;
    const xmlChar *name;

    xmlNode *ref_node;
    xmlNode *parent;
    xmlNode *test_node;

    xmlNode *prev_next;
    xmlNode *next_prev;
    xmlNode *parent_childs;
    xmlNode *parent_last;

    xmlElement *element_desc;

    if (prev == NULL && next == NULL)
        return(-1);

    if (names == NULL) return(-1);
    if (max <= 0) return(-1);

    memset(&vctxt, 0, sizeof (xmlValidCtxt));
    vctxt.error = xmlNoValidityErr;	/* this suppresses err/warn output */

    nb_valid_elements = 0;
    ref_node = prev ? prev : next;
    parent = ref_node->parent;

    /*
     * Retrieves the parent element declaration
     */
    element_desc = xmlGetDtdElementDesc(parent->doc->intSubset,
                                         parent->name);
    if ((element_desc == NULL) && (parent->doc->extSubset != NULL))
        element_desc = xmlGetDtdElementDesc(parent->doc->extSubset,
                                             parent->name);
    if (element_desc == NULL) return(-1);

    /*
     * Do a backup of the current tree structure
     */
    prev_next = prev ? prev->next : NULL;
    next_prev = next ? next->prev : NULL;
    parent_childs = parent->children;
    parent_last = parent->last;

    /*
     * Creates a dummy node and insert it into the tree
     */
    test_node = xmlNewDocNode (ref_node->doc, NULL, BAD_CAST "<!dummy?>", NULL);
    if (test_node == NULL)
        return(-1);

    test_node->parent = parent;
    test_node->prev = prev;
    test_node->next = next;
    name = test_node->name;

    if (prev) prev->next = test_node;
    else parent->children = test_node;

    if (next) next->prev = test_node;
    else parent->last = test_node;

    /*
     * Insert each potential child node and check if the parent is
     * still valid
     */
    nb_elements = xmlValidGetPotentialChildren(element_desc->content,
		       elements, &nb_elements, 256);

    for (i = 0;i < nb_elements;i++) {
	test_node->name = elements[i];
	if (xmlValidateOneElement(&vctxt, parent->doc, parent)) {
	    int j;

	    for (j = 0; j < nb_valid_elements;j++)
		if (xmlStrEqual(elements[i], names[j])) break;
	    names[nb_valid_elements++] = elements[i];
	    if (nb_valid_elements >= max) break;
	}
    }

    /*
     * Restore the tree structure
     */
    if (prev) prev->next = prev_next;
    if (next) next->prev = next_prev;
    parent->children = parent_childs;
    parent->last = parent_last;

    /*
     * Free up the dummy node
     */
    test_node->name = name;
    xmlFreeNode(test_node);

    return(nb_valid_elements);
}